

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

bool __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::insert(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,allow a)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  time_point now;
  undefined8 uVar4;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  lVar1 = (this->m_ttl).__r;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    bVar2 = do_insert_update(this,key,value,now,(time_point)(lVar1 * 1000000 + (long)now.__d.__r),a)
    ;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return bVar2;
  }
  uVar4 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

auto insert(const key_type& key, value_type value, allow a = allow::insert_or_update) -> bool
    {
        auto now         = std::chrono::steady_clock::now();
        auto expire_time = now + m_ttl;

        std::lock_guard guard{m_lock};
        return do_insert_update(key, std::move(value), now, expire_time, a);
    }